

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult access_lor_ns(CPUARMState_conflict *env)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = arm_current_el(env);
  if (iVar1 < 2) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if ((uVar2 >> 0x23 & 1) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  else if (iVar1 != 2) {
    return CP_ACCESS_OK;
  }
  if (((env->cp15).scr_el3 & 0x4000) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL3;
}

Assistant:

static CPAccessResult access_lor_ns(CPUARMState *env)
{
    int el = arm_current_el(env);

    if (el < 2 && (arm_hcr_el2_eff(env) & HCR_TLOR)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 && (env->cp15.scr_el3 & SCR_TLOR)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}